

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O0

void picosha2::detail::hash256_block<unsigned_long*,unsigned_char*>
               (unsigned_long *message_digest,uchar *first,uchar *last)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  word_t wVar5;
  word_t wVar6;
  word_t wVar7;
  long lVar8;
  ulong local_2a0;
  size_t i_3;
  word_t temp2;
  word_t temp1;
  size_t i_2;
  word_t h;
  word_t g;
  word_t f;
  word_t e;
  word_t d;
  word_t c;
  word_t b;
  word_t a;
  size_t i_1;
  size_t i;
  unsigned_long local_228;
  word_t w [64];
  uchar *last_local;
  uchar *first_local;
  unsigned_long *message_digest_local;
  
  if (first + 0x40 == last) {
    i._4_4_ = 0;
    std::fill<unsigned_long*,int>(&local_228,w + 0x3f,(int *)((long)&i + 4));
    for (i_1 = 0; i_1 < 0x10; i_1 = i_1 + 1) {
      bVar1 = mask_8bit(first[i_1 * 4]);
      bVar2 = mask_8bit(first[i_1 * 4 + 1]);
      bVar3 = mask_8bit(first[i_1 * 4 + 2]);
      bVar4 = mask_8bit(first[i_1 * 4 + 3]);
      w[i_1 - 1] = (ulong)bVar1 << 0x18 | (ulong)bVar2 << 0x10 | (ulong)bVar3 << 8 | (ulong)bVar4;
    }
    for (a = 0x10; a < 0x40; a = a + 1) {
      wVar5 = ssig1(w[a - 3]);
      wVar7 = w[a - 8];
      wVar6 = ssig0(w[a - 0x10]);
      wVar7 = mask_32bit(wVar5 + wVar7 + wVar6 + w[a - 0x11]);
      w[a - 1] = wVar7;
    }
    b = *message_digest;
    c = message_digest[1];
    d = message_digest[2];
    e = message_digest[3];
    f = message_digest[4];
    g = message_digest[5];
    h = message_digest[6];
    i_2 = message_digest[7];
    for (temp1 = 0; temp1 < 0x40; temp1 = temp1 + 1) {
      wVar7 = bsig1(f);
      wVar5 = ch(f,g,h);
      lVar8 = i_2 + wVar7 + wVar5 + *(long *)(add_constant + temp1 * 8) + w[temp1 - 1];
      wVar7 = bsig0(b);
      wVar5 = maj(b,c,d);
      i_2 = h;
      h = g;
      g = f;
      f = mask_32bit(e + lVar8);
      e = d;
      d = c;
      c = b;
      b = mask_32bit(lVar8 + wVar7 + wVar5);
    }
    *message_digest = b + *message_digest;
    message_digest[1] = c + message_digest[1];
    message_digest[2] = d + message_digest[2];
    message_digest[3] = e + message_digest[3];
    message_digest[4] = f + message_digest[4];
    message_digest[5] = g + message_digest[5];
    message_digest[6] = h + message_digest[6];
    message_digest[7] = i_2 + message_digest[7];
    for (local_2a0 = 0; local_2a0 < 8; local_2a0 = local_2a0 + 1) {
      wVar7 = mask_32bit(message_digest[local_2a0]);
      message_digest[local_2a0] = wVar7;
    }
    return;
  }
  __assert_fail("first + 64 == last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/simontime[P]devicecert-validator/picosha2.h"
                ,0x5d,
                "void picosha2::detail::hash256_block(RaIter1, RaIter2, RaIter2) [RaIter1 = unsigned long *, RaIter2 = unsigned char *]"
               );
}

Assistant:

void hash256_block(RaIter1 message_digest, RaIter2 first, RaIter2 last) {
    assert(first + 64 == last);
    static_cast<void>(last);  // for avoiding unused-variable warning
    word_t w[64];
    std::fill(w, w + 64, 0);
    for (std::size_t i = 0; i < 16; ++i) {
        w[i] = (static_cast<word_t>(mask_8bit(*(first + i * 4))) << 24) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 1))) << 16) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 2))) << 8) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 3))));
    }
    for (std::size_t i = 16; i < 64; ++i) {
        w[i] = mask_32bit(ssig1(w[i - 2]) + w[i - 7] + ssig0(w[i - 15]) +
                          w[i - 16]);
    }

    word_t a = *message_digest;
    word_t b = *(message_digest + 1);
    word_t c = *(message_digest + 2);
    word_t d = *(message_digest + 3);
    word_t e = *(message_digest + 4);
    word_t f = *(message_digest + 5);
    word_t g = *(message_digest + 6);
    word_t h = *(message_digest + 7);

    for (std::size_t i = 0; i < 64; ++i) {
        word_t temp1 = h + bsig1(e) + ch(e, f, g) + add_constant[i] + w[i];
        word_t temp2 = bsig0(a) + maj(a, b, c);
        h = g;
        g = f;
        f = e;
        e = mask_32bit(d + temp1);
        d = c;
        c = b;
        b = a;
        a = mask_32bit(temp1 + temp2);
    }
    *message_digest += a;
    *(message_digest + 1) += b;
    *(message_digest + 2) += c;
    *(message_digest + 3) += d;
    *(message_digest + 4) += e;
    *(message_digest + 5) += f;
    *(message_digest + 6) += g;
    *(message_digest + 7) += h;
    for (std::size_t i = 0; i < 8; ++i) {
        *(message_digest + i) = mask_32bit(*(message_digest + i));
    }
}